

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-bson.c
# Opt level: O1

int lobjectid(lua_State *L)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  time_t tVar4;
  uint uVar5;
  long lVar7;
  ulong uVar8;
  lua_State *plVar9;
  byte bVar11;
  uint8_t oid [14];
  size_t len;
  char local_30 [2];
  uint local_2e;
  undefined2 local_2a;
  undefined2 uStack_28;
  uint8_t uStack_26;
  undefined1 uStack_25;
  undefined1 uStack_24;
  undefined1 uStack_23;
  size_t local_20;
  ulong uVar6;
  undefined7 uVar10;
  
  uStack_28 = 0;
  uStack_26 = '\0';
  uStack_25 = 0;
  uStack_24 = 0;
  uStack_23 = 0;
  local_30[0] = '\0';
  local_30[1] = '\a';
  local_2e = 0;
  local_2a = 0;
  iVar2 = lua_isstring(L,1);
  if (iVar2 == 0) {
    tVar4 = time((time_t *)0x0);
    LOCK();
    UNLOCK();
    uVar5 = (uint)tVar4;
    local_2e = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    local_2a = (undefined2)oid_header._0_4_;
    uStack_28 = SUB42(oid_header._0_4_,2);
    uStack_26 = oid_header[4];
    uStack_25 = (undefined1)(oid_counter >> 0x10);
    uStack_24 = (undefined1)(oid_counter >> 8);
    uStack_23 = (undefined1)oid_counter;
    oid_counter = oid_counter + 1;
  }
  else {
    plVar9 = L;
    pcVar3 = lua_tolstring(L,1,&local_20);
    if (local_20 == 0x18) {
      lVar7 = 0;
      do {
        cVar1 = pcVar3[lVar7 * 2];
        uVar10 = (undefined7)((ulong)plVar9 >> 8);
        uVar8 = CONCAT71(uVar10,cVar1);
        uVar5 = (int)uVar8 - 0x30;
        uVar6 = (ulong)uVar5;
        if (9 < (byte)uVar5) {
          if ((byte)(cVar1 + 0x9fU) < 0x1a) {
            uVar8 = CONCAT71(uVar10,cVar1 + -0x57);
            uVar6 = uVar8 & 0xffffffff;
          }
          else {
            uVar8 = CONCAT71(uVar10,cVar1 - 0x37U);
            uVar6 = (ulong)(byte)(cVar1 - 0x37U);
            if (0x19 < (byte)(cVar1 + 0xbfU)) {
              uVar6 = 0;
            }
          }
        }
        cVar1 = pcVar3[lVar7 * 2 + 1];
        uVar10 = (undefined7)(uVar8 >> 8);
        plVar9 = (lua_State *)CONCAT71(uVar10,cVar1);
        bVar11 = cVar1 - 0x30;
        if (9 < bVar11) {
          if ((byte)(cVar1 + 0x9fU) < 0x1a) {
            bVar11 = cVar1 + 0xa9;
            plVar9 = (lua_State *)CONCAT71(uVar10,bVar11);
          }
          else {
            bVar11 = cVar1 - 0x37;
            plVar9 = (lua_State *)CONCAT71(uVar10,bVar11);
            if (0x19 < (byte)(cVar1 + 0xbfU)) {
              bVar11 = 0;
            }
          }
        }
        bVar11 = (char)uVar6 << 4 | bVar11;
        iVar2 = (int)CONCAT71((int7)(uVar6 >> 8),bVar11);
        *(byte *)((long)&local_2e + lVar7) = bVar11;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0xc);
    }
    else {
      iVar2 = luaL_error(L,"Invalid objectid %s",pcVar3);
    }
    if (local_20 != 0x18) {
      return iVar2;
    }
  }
  lua_pushlstring(L,local_30,0xe);
  return 1;
}

Assistant:

static int
lobjectid(lua_State *L) {
	uint8_t oid[14] = { 0, BSON_OBJECTID };
	if (lua_isstring(L,1)) {
		size_t len;
		const char * str = lua_tolstring(L,1,&len);
		if (len != 24) {
			return luaL_error(L, "Invalid objectid %s", str);
		}
		int i;
		for (i=0;i<12;i++) {
			oid[i+2] = hextoint(str[i*2]) << 4 | hextoint(str[i*2+1]);
		}
	} else {
		time_t ti = time(NULL);
		// old_counter is a static var, use atom inc.
		uint32_t id = ATOM_FINC(&oid_counter);

		oid[2] = (ti>>24) & 0xff;
		oid[3] = (ti>>16) & 0xff;
		oid[4] = (ti>>8) & 0xff;
		oid[5] = ti & 0xff;
		memcpy(oid+6 , oid_header, 5);
		oid[11] = (id>>16) & 0xff; 
		oid[12] = (id>>8) & 0xff; 
		oid[13] = id & 0xff;
	}
	lua_pushlstring( L, (const char *)oid, 14);

	return 1;
}